

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::readLinearizationData(QPDF *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int i;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  _func_int **pp_Var4;
  BitStream h;
  BitStream h_00;
  BitStream h_01;
  Pipeline *pl;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  longlong lVar11;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar12;
  _func_int *p_Var13;
  uchar *p;
  size_t nbytes;
  logic_error *this_00;
  QPDFExc *pQVar14;
  type ii;
  BitStream *this_01;
  ulong uVar15;
  Pl_Buffer pb;
  QPDFObjectHandle P;
  vector<int,_std::allocator<int>_> H_items;
  QPDFObjectHandle oh;
  QPDFObjectHandle N;
  QPDFObjectHandle H;
  QPDFObjectHandle HO;
  QPDFObjectHandle H0;
  QPDFObjectHandle T;
  QPDFObjectHandle E;
  QPDFObjectHandle O;
  shared_ptr<Buffer> hbp;
  QPDFObjectHandle HS;
  string local_1f8;
  undefined1 local_1d8 [56];
  Pipeline *local_1a0;
  QPDFObjectHandle local_198;
  vector<int,_std::allocator<int>_> local_188;
  undefined1 local_168 [32];
  QPDFObjectHandle local_148;
  QPDFObjectHandle local_138;
  QPDFObjectHandle local_128;
  string local_118;
  QPDFObjectHandle local_f8;
  QPDFObjectHandle local_e8;
  undefined1 local_d8 [24];
  undefined1 local_c0 [16];
  Pipeline *local_b0;
  BitStream local_a8;
  BitStream local_80;
  BitStream local_58;
  
  bVar5 = isLinearized(this);
  if (!bVar5) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"called readLinearizationData for file that is not linearized");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pp_Var4 = (_func_int **)(local_1d8 + 0x10);
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/H","");
  QPDFObjectHandle::getKey(&local_138,(string *)&(_Var3._M_head_impl)->lindict);
  if ((_func_int **)local_1d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/O","");
  QPDFObjectHandle::getKey(&local_e8,(string *)&(_Var3._M_head_impl)->lindict);
  if ((_func_int **)local_1d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/E","");
  QPDFObjectHandle::getKey(&local_f8,(string *)&(_Var3._M_head_impl)->lindict);
  if ((_func_int **)local_1d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/N","");
  QPDFObjectHandle::getKey(&local_148,(string *)&(_Var3._M_head_impl)->lindict);
  if ((_func_int **)local_1d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/T","");
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&local_118.field_2,(string *)&(_Var3._M_head_impl)->lindict);
  if ((_func_int **)local_1d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  _Var3._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"/P","");
  QPDFObjectHandle::getKey(&local_198,(string *)&(_Var3._M_head_impl)->lindict);
  if ((_func_int **)local_1d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  bVar5 = QPDFObjectHandle::isArray(&local_138);
  if (bVar5) {
    bVar5 = QPDFObjectHandle::isInteger(&local_e8);
    if (bVar5) {
      bVar5 = QPDFObjectHandle::isInteger(&local_f8);
      if (bVar5) {
        bVar5 = QPDFObjectHandle::isInteger(&local_148);
        if (bVar5) {
          bVar5 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&local_118.field_2);
          if (bVar5) {
            bVar5 = QPDFObjectHandle::isInteger(&local_198);
            if (!bVar5) {
              bVar5 = QPDFObjectHandle::isNull(&local_198);
              if (!bVar5) goto LAB_002119d0;
            }
            iVar6 = QPDFObjectHandle::getArrayNItems(&local_138);
            if (iVar6 < 0) {
              QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar6);
            }
            local_1a0 = (Pipeline *)this;
            if ((iVar6 != 2) && (iVar6 != 4)) {
              pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
              local_1d8._0_8_ = local_1d8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1d8,"linearization dictionary","");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f8,"H has the wrong number of items","");
              damagedPDF(pQVar14,(QPDF *)local_1a0,(string *)local_1d8,&local_1f8);
              __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
            }
            local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (int *)0x0;
            local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (int *)0x0;
            local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (int *)0x0;
            uVar15 = 0;
            do {
              if (uVar15 >> 0x1f != 0) {
                QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar15);
              }
              QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,(int)&local_138);
              bVar5 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_168);
              if (!bVar5) {
                pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
                local_1d8._0_8_ = local_1d8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1d8,"linearization dictionary","");
                local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1f8,"some H items are of the wrong type","");
                damagedPDF(pQVar14,(QPDF *)local_1a0,(string *)local_1d8,&local_1f8);
                __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
              }
              iVar7 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)local_168);
              local_1d8._0_4_ = iVar7;
              if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_188,
                           (iterator)
                           local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_1d8);
              }
              else {
                *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar7;
                local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
              }
              uVar15 = uVar15 + 1;
            } while ((long)iVar6 != uVar15);
            if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0);
            }
            if ((ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) < 2) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,1);
            }
            iVar7 = 0;
            iVar6 = 0;
            if ((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x10) {
              iVar6 = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[2];
              iVar7 = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[3];
            }
            iVar2 = *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            i = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1];
            bVar5 = QPDFObjectHandle::isInteger(&local_198);
            iVar8 = 0;
            if (bVar5) {
              iVar8 = QPDFObjectHandle::getIntValueAsInt(&local_198);
            }
            lVar11 = QPDFObjectHandle::getIntValue(&local_148);
            pvVar12 = getAllPages((QPDF *)local_1a0);
            if (lVar11 != (long)(pvVar12->
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar12->
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 4) {
              pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
              local_1d8._0_8_ = local_1d8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1d8,"linearization hint table","");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f8,"/N does not match number of pages","");
              damagedPDF(pQVar14,(QPDF *)local_1a0,(string *)local_1d8,&local_1f8);
              __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
            }
            iVar9 = QPDFObjectHandle::getIntValueAsInt(&local_e8);
            *(int *)((long)&((((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                              &local_1a0->_vptr_Pipeline)->_M_t).
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp + 8)
                 = iVar9;
            lVar11 = QPDFObjectHandle::getIntValue(&local_f8);
            *(longlong *)
             ((long)&((((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                       &local_1a0->_vptr_Pipeline)->_M_t).
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp + 0x10) =
                 lVar11;
            iVar9 = QPDFObjectHandle::getIntValueAsInt(&local_148);
            *(int *)((long)&((((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
                              &local_1a0->_vptr_Pipeline)->_M_t).
                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                             .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linp +
                    0x18) = iVar9;
            p_Var13 = (_func_int *)
                      QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_118.field_2);
            pl = local_1a0;
            pp_Var4 = local_1a0->_vptr_Pipeline;
            pp_Var4[0x69] = p_Var13;
            *(int *)(pp_Var4 + 0x6a) = iVar8;
            pp_Var4[0x6b] = (_func_int *)(long)iVar2;
            pp_Var4[0x6c] = (_func_int *)(long)i;
            Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_1d8,"hint buffer",(Pipeline *)0x0);
            if (i < 0) {
              QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
            }
            readHintStream((QPDF *)&local_118,pl,(qpdf_offset_t)local_1d8,(size_t)(long)iVar2);
            if (iVar6 != 0) {
              if (iVar7 < 0) {
                QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar7);
              }
              readHintStream((QPDF *)(local_c0 + 8),pl,(qpdf_offset_t)local_1d8,(long)iVar6);
              if (local_b0 != (Pipeline *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
              }
            }
            paVar1 = &local_1f8.field_2;
            local_1f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/S","");
            QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_d8 + 0x10),&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            local_1f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/O","");
            QPDFObjectHandle::getKey(&local_128,&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)local_d8);
            p = Buffer::getBuffer((Buffer *)local_d8._0_8_);
            nbytes = Buffer::getSize((Buffer *)local_d8._0_8_);
            BitStream::BitStream(&local_58,p,nbytes);
            h.nbytes = local_58.nbytes;
            h.start = local_58.start;
            h.p = local_58.p;
            h.bit_offset = local_58.bit_offset;
            h.bits_available = local_58.bits_available;
            readHPageOffset((QPDF *)pl,h);
            uVar10 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)(local_d8 + 0x10));
            if (-1 < (int)uVar10) {
              uVar15 = (ulong)uVar10;
              if (uVar15 <= nbytes && nbytes - uVar15 != 0) {
                BitStream::BitStream(&local_80,p + uVar15,nbytes - uVar15);
                h_00.nbytes = local_80.nbytes;
                h_00.start = local_80.start;
                h_00.p = local_80.p;
                h_00.bit_offset = local_80.bit_offset;
                h_00.bits_available = local_80.bits_available;
                readHSharedObject((QPDF *)pl,h_00);
                bVar5 = QPDFObjectHandle::isInteger(&local_128);
                if (!bVar5) {
LAB_0021185b:
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
                  }
                  if (local_128.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_128.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._0_8_);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_118._M_string_length);
                  }
                  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_1d8);
                  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (int *)0x0) {
                    operator_delete(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_188.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_188.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_198.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_198.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_118.field_2._8_8_);
                  }
                  if (local_148.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_148.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (local_f8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_f8.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (local_e8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_e8.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if (local_138.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_138.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  return;
                }
                uVar10 = QPDFObjectHandle::getIntValueAsInt(&local_128);
                if (-1 < (int)uVar10) {
                  uVar15 = (ulong)uVar10;
                  if (uVar15 <= nbytes && nbytes - uVar15 != 0) {
                    this_01 = &local_a8;
                    BitStream::BitStream(this_01,p + uVar15,nbytes - uVar15);
                    h_01.nbytes = local_a8.nbytes;
                    h_01.start = local_a8.start;
                    h_01.p = local_a8.p;
                    h_01.bit_offset = local_a8.bit_offset;
                    h_01.bits_available = local_a8.bits_available;
                    readHGeneric((QPDF *)this_01,h_01,(HGeneric *)(pl->_vptr_Pipeline + 0x80));
                    goto LAB_0021185b;
                  }
                }
                pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
                local_1f8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1f8,"linearization hint table","");
                local_168._0_8_ = local_168 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_168,"/O (outline) offset is out of bounds","");
                damagedPDF(pQVar14,(QPDF *)local_1a0,&local_1f8,(string *)local_168);
                __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
              }
            }
            pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_1f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f8,"linearization hint table","");
            local_168._0_8_ = local_168 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_168,"/S (shared object) offset is out of bounds","");
            damagedPDF(pQVar14,(QPDF *)local_1a0,&local_1f8,(string *)local_168);
            __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
        }
      }
    }
  }
LAB_002119d0:
  pQVar14 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_1d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"linearization dictionary","")
  ;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"some keys in linearization dictionary are of the wrong type","");
  damagedPDF(pQVar14,this,(string *)local_1d8,&local_1f8);
  __cxa_throw(pQVar14,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::readLinearizationData()
{
    // This function throws an exception (which is trapped by checkLinearization()) for any errors
    // that prevent loading.

    if (!isLinearized()) {
        throw std::logic_error("called readLinearizationData for file that is not linearized");
    }

    // /L is read and stored in linp by isLinearized()
    QPDFObjectHandle H = m->lindict.getKey("/H");
    QPDFObjectHandle O = m->lindict.getKey("/O");
    QPDFObjectHandle E = m->lindict.getKey("/E");
    QPDFObjectHandle N = m->lindict.getKey("/N");
    QPDFObjectHandle T = m->lindict.getKey("/T");
    QPDFObjectHandle P = m->lindict.getKey("/P");

    if (!(H.isArray() && O.isInteger() && E.isInteger() && N.isInteger() && T.isInteger() &&
          (P.isInteger() || P.isNull()))) {
        throw damagedPDF(
            "linearization dictionary",
            "some keys in linearization dictionary are of the wrong type");
    }

    // Hint table array: offset length [ offset length ]
    size_t n_H_items = toS(H.getArrayNItems());
    if (!((n_H_items == 2) || (n_H_items == 4))) {
        throw damagedPDF("linearization dictionary", "H has the wrong number of items");
    }

    std::vector<int> H_items;
    for (size_t i = 0; i < n_H_items; ++i) {
        QPDFObjectHandle oh(H.getArrayItem(toI(i)));
        if (oh.isInteger()) {
            H_items.push_back(oh.getIntValueAsInt());
        } else {
            throw damagedPDF("linearization dictionary", "some H items are of the wrong type");
        }
    }

    // H: hint table offset/length for primary and overflow hint tables
    int H0_offset = H_items.at(0);
    int H0_length = H_items.at(1);
    int H1_offset = 0;
    int H1_length = 0;
    if (H_items.size() == 4) {
        // Acrobat doesn't read or write these (as PDF 1.4), so we don't have a way to generate a
        // test case.
        // QTC::TC("qpdf", "QPDF overflow hint table");
        H1_offset = H_items.at(2);
        H1_length = H_items.at(3);
    }

    // P: first page number
    int first_page = 0;
    if (P.isInteger()) {
        QTC::TC("qpdf", "QPDF P present in lindict");
        first_page = P.getIntValueAsInt();
    } else {
        QTC::TC("qpdf", "QPDF P absent in lindict");
    }

    // Store linearization parameter data

    // Various places in the code use linp.npages, which is initialized from N, to pre-allocate
    // memory, so make sure it's accurate and bail right now if it's not.
    if (N.getIntValue() != static_cast<long long>(getAllPages().size())) {
        throw damagedPDF("linearization hint table", "/N does not match number of pages");
    }

    // file_size initialized by isLinearized()
    m->linp.first_page_object = O.getIntValueAsInt();
    m->linp.first_page_end = E.getIntValue();
    m->linp.npages = N.getIntValueAsInt();
    m->linp.xref_zero_offset = T.getIntValue();
    m->linp.first_page = first_page;
    m->linp.H_offset = H0_offset;
    m->linp.H_length = H0_length;

    // Read hint streams

    Pl_Buffer pb("hint buffer");
    QPDFObjectHandle H0 = readHintStream(pb, H0_offset, toS(H0_length));
    if (H1_offset) {
        (void)readHintStream(pb, H1_offset, toS(H1_length));
    }

    // PDF 1.4 hint tables that we ignore:

    //  /T    thumbnail
    //  /A    thread information
    //  /E    named destination
    //  /V    interactive form
    //  /I    information dictionary
    //  /C    logical structure
    //  /L    page label

    // Individual hint table offsets
    QPDFObjectHandle HS = H0.getKey("/S"); // shared object
    QPDFObjectHandle HO = H0.getKey("/O"); // outline

    auto hbp = pb.getBufferSharedPointer();
    Buffer* hb = hbp.get();
    unsigned char const* h_buf = hb->getBuffer();
    size_t h_size = hb->getSize();

    readHPageOffset(BitStream(h_buf, h_size));

    int HSi = HS.getIntValueAsInt();
    if ((HSi < 0) || (toS(HSi) >= h_size)) {
        throw damagedPDF("linearization hint table", "/S (shared object) offset is out of bounds");
    }
    readHSharedObject(BitStream(h_buf + HSi, h_size - toS(HSi)));

    if (HO.isInteger()) {
        int HOi = HO.getIntValueAsInt();
        if ((HOi < 0) || (toS(HOi) >= h_size)) {
            throw damagedPDF("linearization hint table", "/O (outline) offset is out of bounds");
        }
        readHGeneric(BitStream(h_buf + HOi, h_size - toS(HOi)), m->outline_hints);
    }
}